

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O1

uint8_t * bstr_while_predicate_reverse(uint8_t *pBegin,uint8_t *pEnd,_func_int_int *pred_func)

{
  int iVar1;
  uint8_t *pNext;
  uint8_t *puVar2;
  
  puVar2 = pBegin;
  if (pBegin < pEnd) {
    do {
      puVar2 = pEnd;
      if (puVar2 <= pBegin) {
        return puVar2;
      }
      iVar1 = (*pred_func)((int)puVar2[-1]);
      pEnd = puVar2 + -1;
    } while (iVar1 != 0);
  }
  return puVar2;
}

Assistant:

const uint8_t *bstr_while_predicate_reverse(const uint8_t *pBegin, const uint8_t *pEnd, int (*pred_func)(int c) )
{
   if (pBegin < pEnd)
   {
      const uint8_t *pNext = pEnd;
      while (pNext > pBegin)
      {
         const uint8_t *pTest = pNext-1;
         int c = (int) *pTest;
         if (!pred_func(c)){
            break;
         }
         pNext--;
      }
      return pNext;
   }
   return pBegin;
}